

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

int flvtag_addcaption_text(flvtag_t *tag,utf8_char_t *text)

{
  uint32_t uVar1;
  int iVar2;
  sei_t sei;
  caption_frame_t frame;
  sei_t local_1e80;
  caption_frame_t local_1e68;
  
  uVar1 = flvtag_pts(tag);
  sei_init(&local_1e80,(double)uVar1);
  if (text == (utf8_char_t *)0x0) {
    sei_from_caption_clear(&local_1e80);
  }
  else {
    caption_frame_init(&local_1e68);
    caption_frame_from_text(&local_1e68,text);
    sei_from_caption_frame(&local_1e80,&local_1e68);
  }
  iVar2 = flvtag_addsei(tag,&local_1e80);
  sei_free(&local_1e80);
  return iVar2;
}

Assistant:

int flvtag_addcaption_text(flvtag_t* tag, const utf8_char_t* text)
{
    sei_t sei;
    sei_init(&sei, flvtag_pts(tag));

    if (text) {
        caption_frame_t frame;
        caption_frame_init(&frame);
        caption_frame_from_text(&frame, text);
        sei_from_caption_frame(&sei, &frame);
    } else {
        sei_from_caption_clear(&sei);
    }

    int ret = flvtag_addsei(tag, &sei);
    sei_free(&sei);
    return ret;
}